

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  iterator iVar7;
  pointer puVar8;
  pointer ppMVar9;
  pointer ppcVar10;
  cmMakefile *pcVar11;
  pointer pQVar12;
  size_t __n;
  pointer pcVar13;
  string_view suffix;
  _Alloc_hider _Var14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *pvVar18;
  string *psVar19;
  const_iterator cVar20;
  cmSourceFile *pcVar21;
  __node_base_ptr p_Var22;
  string *psVar23;
  undefined8 uVar24;
  PolicyID extraout_EDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  ulong uVar27;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID extraout_EDX_03;
  PolicyID extraout_EDX_04;
  PolicyID PVar25;
  iterator __begin3;
  pointer pAVar28;
  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var29;
  pointer ppMVar30;
  iterator __end4;
  pointer ppcVar31;
  long lVar32;
  undefined1 uVar33;
  __node_base_ptr p_Var34;
  char *pcVar35;
  pointer puVar36;
  string *this_00;
  pointer pQVar37;
  Qrc *qrc_1;
  pointer pQVar38;
  char cVar39;
  iterator __begin3_1;
  pointer pAVar40;
  pointer pQVar41;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  pointer pbVar42;
  long lVar43;
  bool bVar44;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view arg_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  string_view arg_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_13;
  string_view prefix;
  string_view filename;
  string_view text;
  string_view text_00;
  string_view prefix_00;
  string_view suffix_00;
  string suffixedPath;
  string basePath;
  string fullPath;
  MUFileHandle eMuf;
  MUFileHandle muf_1;
  string uiHeaderGenex;
  cmSourceFile *sf;
  anon_class_16_2_e88080e7 makeMUFile;
  string uiHeaderFilePath;
  string local_380;
  string local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  undefined1 local_2f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  __node_base local_2c0;
  size_type sStack_2b8;
  float local_2b0;
  size_t local_2a8;
  _Alloc_hider _Stack_2a0;
  cmQtAutoGenGlobalInitializer *local_298;
  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_290;
  string *local_288;
  string *local_280;
  cmake *local_278;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_270;
  pointer local_268;
  string *local_260;
  string local_258;
  undefined1 local_238 [32];
  undefined1 local_218 [24];
  char *local_200;
  _Alloc_hider local_1f8;
  char *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  char *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  char *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  char *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  __node_base_ptr *local_178;
  undefined1 *local_170;
  __node_base local_168;
  size_type sStack_160;
  float local_158;
  size_t local_150;
  __node_base_ptr p_Stack_148;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  undefined2 local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  pointer pbStack_100;
  pointer local_f8;
  pointer pbStack_f0;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *local_e8;
  vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  *local_e0;
  string *local_d8;
  string *local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  size_t local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_278 = cmMakefile::GetCMakeInstance(this->Makefile);
  local_298 = this->GlobalInitializer;
  local_c8._8_8_ = &local_298->Keywords_;
  local_c8._0_8_ = this;
  pvVar18 = cmGeneratorTarget::GetAllConfigSources(this->GenTarget);
  pAVar28 = (pvVar18->
            super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pAVar40 = (pvVar18->
            super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar28 != pAVar40) {
    local_318 = &(local_278->HeaderFileExtensions).unordered._M_h;
    local_e8 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
               &(this->AutogenTarget).CMP0100HeadersWarn;
    local_260 = (string *)&(this->AutogenTarget).FilesGenerated;
    local_290 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&(this->AutogenTarget).Headers;
    local_270 = &(local_278->CLikeSourceFileExtensions).unordered._M_h;
    local_288 = (string *)&(this->AutogenTarget).Sources;
    local_280 = &(local_298->Keywords_).SKIP_AUTOGEN;
    local_d0 = &(local_298->Keywords_).SKIP_AUTORCC;
    local_d8 = &(local_298->Keywords_).AUTORCC_OPTIONS;
    local_e0 = (vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                *)&(this->Rcc).Qrcs;
    local_268 = pAVar40;
    do {
      local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)cmSourceFile::GetFullPath_abi_cxx11_(pAVar28->Source);
      psVar19 = cmSourceFile::GetExtension_abi_cxx11_(pAVar28->Source);
      cmsys::SystemTools::LowerCase((string *)local_2f0,psVar19);
      if (((this->Moc).super_GenVarsT.Enabled != false) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        local_238._0_8_ = local_2f0._8_8_;
        local_238._8_8_ = local_2f0._0_8_;
        cVar20 = std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(local_318,(key_type *)local_238);
        if (cVar20.
            super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
            _M_cur == (__node_type *)0x0) {
          local_238._0_8_ = local_2f0._8_8_;
          local_238._8_8_ = local_2f0._0_8_;
          cVar20 = std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(local_270,(key_type *)local_238);
          if (cVar20.
              super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&local_360,(cmSourceFile *)local_c8,
                       (string *)pAVar28->Source,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320,
                       (bool)((char)pAVar28 + '\x10'));
            if (((local_360._M_dataplus._M_p[0x43] != '\0') ||
                (local_360._M_dataplus._M_p[0x44] == '\x01')) &&
               (*(char *)&(((string *)(local_360._M_dataplus._M_p + 0x40))->_M_dataplus)._M_p ==
                '\x01')) {
              local_238._0_8_ = local_360._M_dataplus._M_p;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_260,(MUFile **)local_238);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_288,(string *)(local_360._M_dataplus._M_p + 0x20),&local_360);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                        ((default_delete<cmQtAutoGenInitializer::MUFile> *)&local_360,
                         (MUFile *)local_360._M_dataplus._M_p);
            }
          }
        }
        else {
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    ((anon_class_16_2_e88080e7 *)&local_380,(cmSourceFile *)local_c8,
                     (string *)pAVar28->Source,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320,
                     (bool)((char)pAVar28 + '\x10'));
          _Var14._M_p = local_380._M_dataplus._M_p;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(((string *)(local_380._M_dataplus._M_p + 0x20))->_M_dataplus)._M_p;
          cVar39 = '\x01';
          if (local_380._M_dataplus._M_p[0x43] == '\0') {
            cVar39 = local_380._M_dataplus._M_p[0x44];
          }
          local_238._0_8_ = paVar26;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_2f0._8_8_ ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&DAT_00000002 && this->CMP0100Accept == false) &&
             (iVar17 = bcmp((void *)local_2f0._0_8_,"hh",local_2f0._8_8_), iVar17 == 0)) {
            if ((cVar39 != '\0') && (this->CMP0100Warn == true)) {
              iVar7._M_current =
                   (this->AutogenTarget).CMP0100HeadersWarn.
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (this->AutogenTarget).CMP0100HeadersWarn.
                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                _M_realloc_insert<cmSourceFile*const&>(local_e8,iVar7,(cmSourceFile **)local_238);
              }
              else {
                *iVar7._M_current = (cmSourceFile *)paVar26;
                pppcVar1 = &(this->AutogenTarget).CMP0100HeadersWarn.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppcVar1 = *pppcVar1 + 1;
              }
            }
          }
          else {
            if ((cVar39 != '\0') &&
               (*(char *)&(((string *)(_Var14._M_p + 0x40))->_M_dataplus)._M_p == '\x01')) {
              local_360._M_dataplus._M_p = _Var14._M_p;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_260,(MUFile **)&local_360);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      (local_290,(Qrc *)local_238,&local_380);
          }
          pAVar40 = local_268;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                      ((default_delete<cmQtAutoGenInitializer::MUFile> *)&local_380,
                       (MUFile *)local_380._M_dataplus._M_p);
            pAVar40 = local_268;
          }
        }
      }
      if (((((this->Rcc).super_GenVarsT.Enabled == true) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_298->Keywords_).qrc._M_string_length)) &&
          (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0 ||
           (iVar17 = bcmp((void *)local_2f0._0_8_,(local_298->Keywords_).qrc._M_dataplus._M_p,
                          local_2f0._8_8_), iVar17 == 0)))) &&
         ((bVar16 = cmSourceFile::GetPropertyAsBool(pAVar28->Source,local_280), !bVar16 &&
          (bVar16 = cmSourceFile::GetPropertyAsBool(pAVar28->Source,local_d0), !bVar16)))) {
        local_238._0_8_ = local_238 + 0x10;
        local_238._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
        local_218._0_8_ = local_218 + 0x10;
        local_218._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
        local_1f8._M_p = (pointer)&local_1e8;
        local_1f0 = (char *)0x0;
        local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
        local_1d8._M_p = (pointer)&local_1c8;
        local_1d0 = (char *)0x0;
        local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
        local_1b8._M_p = (pointer)&local_1a8;
        local_1b0 = (char *)0x0;
        local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
        local_198._M_p = (pointer)&local_188;
        local_190 = (char *)0x0;
        local_188._M_local_buf[0] = '\0';
        local_178 = &p_Stack_148;
        local_170 = &DAT_00000001;
        local_168._M_nxt = (_Hash_node_base *)0x0;
        sStack_160 = 0;
        local_158 = 1.0;
        local_150 = 0;
        p_Stack_148 = (__node_base_ptr)0x0;
        local_140._M_p = (pointer)&local_130;
        local_138 = 0;
        local_130._M_local_buf[0] = '\0';
        local_120._0_1_ = false;
        local_120._1_1_ = false;
        local_f8 = (pointer)0x0;
        pbStack_f0 = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pbStack_100 = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)local_218);
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_360,(string *)local_218);
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                   local_360.field_2._M_local_buf[0]) + 1);
        }
        bVar16 = cmSourceFile::GetIsGenerated(pAVar28->Source,GlobalAndLocal);
        local_120._0_1_ = bVar16;
        psVar19 = cmSourceFile::GetSafeProperty(pAVar28->Source,local_d8);
        if (psVar19->_M_string_length != 0) {
          arg._M_str = (psVar19->_M_dataplus)._M_p;
          arg._M_len = psVar19->_M_string_length;
          cmExpandList(arg,&local_118,false);
        }
        std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
        emplace_back<cmQtAutoGenInitializer::Qrc>
                  ((vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                    *)local_e0,(Qrc *)local_238);
        Qrc::~Qrc((Qrc *)local_238);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2f0 + 0x10)) {
        operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
      }
      pAVar28 = pAVar28 + 1;
    } while (pAVar28 != pAVar40);
  }
  cmGeneratorTarget::ClearSourcesCache(this->GenTarget);
  if ((((this->Moc).super_GenVarsT.Enabled != false) ||
      (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) &&
     (psVar19 = (string *)(this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt,
     psVar19 != (string *)0x0)) {
    local_280 = (string *)&(this->AutogenTarget).CMP0100HeadersWarn;
    local_270 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&(this->AutogenTarget).FilesGenerated;
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(this->AutogenTarget).Headers;
    local_268 = (pointer)paVar26;
    do {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(psVar19->field_2)._M_allocated_capacity;
      if ((*(char *)((long)&(((string *)(&paVar2->_M_allocated_capacity + 8))->_M_dataplus)._M_p + 3
                    ) != '\0') ||
         (*(char *)((long)&(((string *)(&paVar2->_M_allocated_capacity + 8))->_M_dataplus)._M_p + 4)
          == '\x01')) {
        local_288 = psVar19;
        psVar19 = cmSourceFile::ResolveFullPath
                            ((cmSourceFile *)
                             (((string *)(&paVar2->_M_allocated_capacity + 4))->_M_dataplus)._M_p,
                             (string *)0x0,(string *)0x0);
        filename._M_str = (char *)paVar26;
        filename._M_len = (size_t)(psVar19->_M_dataplus)._M_p;
        cmQtAutoGen::SubDirPrefix_abi_cxx11_
                  ((string *)local_2f0,(cmQtAutoGen *)psVar19->_M_string_length,filename);
        uVar15 = local_2f0._8_8_;
        uVar24 = local_2f0._0_8_;
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_380,psVar19);
        local_238._0_8_ = uVar15;
        local_238._8_8_ = uVar24;
        local_238._16_8_ = local_380._M_string_length;
        local_238._24_8_ = local_380._M_dataplus._M_p;
        views._M_len = 2;
        views._M_array = (iterator)local_238;
        cmCatViews_abi_cxx11_(&local_360,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2f0 + 0x10)) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)(&paVar2->_M_allocated_capacity + 5);
        p_Var29 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   *)0x0;
        local_320 = paVar2;
        do {
          local_238._16_8_ = *(undefined8 *)(p_Var29 + 0x8cb8c8);
          local_238._24_8_ = *(undefined8 *)(p_Var29 + 0x8cb8d0);
          local_238._0_8_ = local_360._M_string_length;
          local_238._8_8_ = local_360._M_dataplus._M_p;
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_238;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_string_length;
          cmCatViews_abi_cxx11_(&local_380,views_00);
          pbVar3 = (local_278->HeaderFileExtensions).ordered.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_290 = p_Var29;
          for (pbVar42 = (local_278->HeaderFileExtensions).ordered.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar42 != pbVar3;
              pbVar42 = pbVar42 + 1) {
            local_2f0._0_8_ = &DAT_00000001;
            local_2f0._8_8_ = local_2f0 + 0x10;
            local_2f0[0x10] = 0x2e;
            local_238._0_8_ = local_380._M_string_length;
            local_238._8_8_ = local_380._M_dataplus._M_p;
            local_238._16_8_ = &DAT_00000001;
            local_218._8_8_ = (pbVar42->_M_dataplus)._M_p;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pbVar42->_M_string_length;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_238;
            local_238._24_8_ = local_2f0._8_8_;
            local_218._0_8_ = paVar26;
            cmCatViews_abi_cxx11_((string *)&local_340,views_01);
            pcVar21 = cmMakefile::GetSource(this->Makefile,(string *)&local_340,Known);
            if (pcVar21 == (cmSourceFile *)0x0) {
              bVar16 = cmsys::SystemTools::FileExists((string *)&local_340);
              if (bVar16) {
                paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&DAT_00000001;
                pcVar21 = cmMakefile::CreateSource(this->Makefile,(string *)&local_340,false,Known);
              }
LAB_002487c4:
              if (pcVar21 != (cmSourceFile *)0x0) {
LAB_002487de:
                paVar26 = &local_340;
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)&local_310,(cmSourceFile *)local_c8,
                           (string *)pcVar21,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_340,
                           SUB81(local_318,0));
                uVar24 = local_310._M_allocated_capacity;
                if (*(char *)((long)local_320 + 0x43) == '\0') {
                  *(undefined1 *)(local_310._M_allocated_capacity + 0x43) = 0;
                }
                if (*(char *)((long)local_320 + 0x44) == '\0') {
                  *(undefined1 *)(local_310._M_allocated_capacity + 0x44) = 0;
                }
                paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(local_310._M_allocated_capacity + 0x20))->_M_allocated_capacity;
                cVar39 = '\x01';
                if (*(char *)(local_310._M_allocated_capacity + 0x43) == '\0') {
                  cVar39 = *(char *)(local_310._M_allocated_capacity + 0x44);
                }
                local_238._0_8_ = paVar2;
                if (((this->CMP0100Accept == false) && (pbVar42->_M_string_length == 2)) &&
                   (iVar17 = bcmp((pbVar42->_M_dataplus)._M_p,"hh",2), iVar17 == 0)) {
                  if ((cVar39 != '\0') && (this->CMP0100Warn == true)) {
                    iVar7._M_current =
                         (this->AutogenTarget).CMP0100HeadersWarn.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (this->AutogenTarget).CMP0100HeadersWarn.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)local_280,
                                 iVar7,(cmSourceFile **)local_238);
                    }
                    else {
                      *iVar7._M_current = (cmSourceFile *)paVar2;
                      pppcVar1 = &(this->AutogenTarget).CMP0100HeadersWarn.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      *pppcVar1 = *pppcVar1 + 1;
                    }
                  }
                }
                else {
                  if ((cVar39 != '\0') &&
                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(uVar24 + 0x40))->_M_local_buf[0] == '\x01')) {
                    local_2f0._0_8_ = uVar24;
                    std::
                    vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                    ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                              ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                                *)local_270,(MUFile **)local_2f0);
                  }
                  std::
                  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)local_268,local_238,&local_310);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_allocated_capacity !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                            ((default_delete<cmQtAutoGenInitializer::MUFile> *)
                             local_310._M_local_buf,(MUFile *)local_310._M_allocated_capacity);
                }
              }
            }
            else {
              uVar4 = (this->AutogenTarget).Headers._M_h._M_bucket_count;
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)pcVar21 % uVar4);
              p_Var5 = (this->AutogenTarget).Headers._M_h._M_buckets[(long)paVar26];
              p_Var22 = (__node_base_ptr)0x0;
              if ((p_Var5 != (__node_base_ptr)0x0) &&
                 (p_Var22 = p_Var5, p_Var34 = p_Var5->_M_nxt,
                 pcVar21 != (cmSourceFile *)p_Var5->_M_nxt[1]._M_nxt)) {
                while (p_Var6 = p_Var34->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
                  p_Var22 = (__node_base_ptr)0x0;
                  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((ulong)p_Var6[1]._M_nxt % uVar4) != paVar26) ||
                     (p_Var22 = p_Var34, p_Var34 = p_Var6,
                     pcVar21 == (cmSourceFile *)p_Var6[1]._M_nxt)) goto LAB_002487a4;
                }
                p_Var22 = (__node_base_ptr)0x0;
              }
LAB_002487a4:
              if ((p_Var22 == (__node_base_ptr)0x0) || (p_Var22->_M_nxt == (_Hash_node_base *)0x0))
              {
                bVar16 = cmSourceFile::GetIsGenerated(pcVar21,GlobalAndLocal);
                if (bVar16) goto LAB_002487c4;
                bVar16 = cmsys::SystemTools::FileExists((string *)&local_340);
                if (!bVar16) goto LAB_002488f0;
                goto LAB_002487de;
              }
            }
LAB_002488f0:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_allocated_capacity != &local_330) {
              operator_delete((void *)local_340._M_allocated_capacity,
                              local_330._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
          p_Var29 = local_290 + 0x10;
        } while (p_Var29 !=
                 (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)0x20);
        psVar19 = local_288;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                   local_360.field_2._M_local_buf[0]) + 1);
          psVar19 = local_288;
        }
      }
      psVar19 = (string *)((_Hashtable *)&psVar19->_M_dataplus)->_M_buckets;
    } while (psVar19 != (string *)0x0);
  }
  if (((this->Moc).super_GenVarsT.Enabled != false) ||
     (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
    puVar36 = (this->Makefile->SourceFiles).
              super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->Makefile->SourceFiles).
             super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar36 != puVar8) {
      local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_278->HeaderFileExtensions).unordered;
      local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&(this->AutogenTarget).Headers;
      local_d8 = (string *)&(this->AutogenTarget).CMP0100HeadersWarn;
      local_290 = (_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   *)&(this->AutogenTarget).FilesGenerated;
      local_278 = (cmake *)&(local_278->CLikeSourceFileExtensions).unordered;
      local_268 = (pointer)&(this->AutogenTarget).Sources;
      local_270 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&(local_298->Keywords_).SKIP_AUTOGEN;
      local_288 = &(local_298->Keywords_).SKIP_AUTOUIC;
      local_260 = &(local_298->Keywords_).AUTOUIC_OPTIONS;
      local_e0 = (vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  *)&(this->Uic).UiFilesWithOptions;
      local_e8 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                 &(this->Uic).UiFilesNoOptions;
      local_d0 = (string *)&(this->Uic).UiHeaders;
      local_280 = (string *)&(this->Uic).SkipUi;
      do {
        local_360._M_string_length = 0;
        local_360.field_2._M_local_buf[0] = '\0';
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        psVar19 = cmSourceFile::ResolveFullPath
                            ((puVar36->_M_t).
                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                             .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,&local_360,
                             (string *)0x0);
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_360._M_string_length ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) && (psVar19->_M_string_length != 0)) {
          psVar23 = cmSourceFile::GetExtension_abi_cxx11_
                              ((puVar36->_M_t).
                               super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                               .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
          cmsys::SystemTools::LowerCase(&local_380,psVar23);
          local_238._0_8_ = local_380._M_string_length;
          local_238._8_8_ = local_380._M_dataplus._M_p;
          cVar20 = std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_320,(key_type *)local_238);
          if (cVar20.
              super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_238._0_8_ = local_380._M_string_length;
            local_238._8_8_ = local_380._M_dataplus._M_p;
            cVar20 = std::
                     _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_278,(key_type *)local_238);
            if (cVar20.
                super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              if ((((this->Uic).super_GenVarsT.Enabled == true) &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_380._M_string_length ==
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_298->Keywords_).ui._M_string_length)) &&
                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_380._M_string_length ==
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0 ||
                  (iVar17 = bcmp(local_380._M_dataplus._M_p,
                                 (local_298->Keywords_).ui._M_dataplus._M_p,
                                 local_380._M_string_length), iVar17 == 0)))) {
                bVar16 = cmSourceFile::GetPropertyAsBool
                                   ((puVar36->_M_t).
                                    super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                    .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                    (string *)local_270);
                if ((bVar16) ||
                   (bVar16 = cmSourceFile::GetPropertyAsBool
                                       ((puVar36->_M_t).
                                        super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                        .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                        local_288), bVar16)) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_280,psVar19);
                }
                else {
                  psVar23 = cmSourceFile::GetSafeProperty
                                      ((puVar36->_M_t).
                                       super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                       .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                                       local_260);
                  local_340._M_allocated_capacity = (size_type)&local_330;
                  pcVar13 = (psVar23->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_340,pcVar13,pcVar13 + psVar23->_M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_340._8_8_ ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string_const&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_e8,psVar19);
                  }
                  else {
                    arg_00._M_str = (char *)local_340._M_allocated_capacity;
                    arg_00._M_len = local_340._8_8_;
                    cmExpandedList_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_238,arg_00,false);
                    std::
                    vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ::
                    emplace_back<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              (local_e0,psVar19,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_238);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_238);
                  }
                  psVar23 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(this->LocalGen);
                  cmsys::SystemTools::GetFilenamePath((string *)local_238,psVar19);
                  cmSystemTools::RelativePath((string *)&local_310,psVar23,(string *)local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_238 + 0x10)) {
                    operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
                  }
                  if (((pointer)local_310._8_8_ != (pointer)0x0) &&
                     (((undefined1 *)(local_310._M_allocated_capacity - 1))[local_310._8_8_] != '/')
                     ) {
                    std::__cxx11::string::push_back((char)&local_310);
                  }
                  uVar15 = local_310._8_8_;
                  uVar24 = local_310._M_allocated_capacity;
                  local_2f0._0_8_ = &DAT_00000001;
                  local_2f0._8_8_ = local_2f0 + 0x10;
                  local_2f0[0x10] = 0x2f;
                  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_258,psVar19);
                  local_238._0_8_ = local_2f0._0_8_;
                  local_238._8_8_ = local_2f0._8_8_;
                  local_238._16_8_ = uVar15;
                  local_238._24_8_ = uVar24;
                  local_218._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x3;
                  local_218._8_8_ = "ui_";
                  local_218._16_8_ = local_258._M_string_length;
                  local_200 = local_258._M_dataplus._M_p;
                  local_1f8._M_p = &DAT_00000002;
                  local_1f0 = ".h";
                  views_02._M_len = 5;
                  views_02._M_array = (iterator)local_238;
                  cmCatViews_abi_cxx11_(&local_78,views_02);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p != &local_258.field_2) {
                    operator_delete(local_258._M_dataplus._M_p,
                                    CONCAT71(local_258.field_2._1_7_,
                                             local_258.field_2._M_local_buf[0]) + 1);
                  }
                  local_2f0._0_8_ = local_2f0 + 0x10;
                  local_2f0._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_2f0._16_8_ = local_2f0._16_8_ & 0xffffffffffffff00;
                  local_2d0._M_allocated_capacity = (size_type)&_Stack_2a0;
                  local_2d0._8_8_ = 1;
                  local_2c0._M_nxt = (_Hash_node_base *)0x0;
                  sStack_2b8 = 0;
                  local_2b0 = 1.0;
                  local_2a8 = 0;
                  _Stack_2a0._M_p = (pointer)0x0;
                  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                  local_258._M_string_length = 0;
                  local_258.field_2._M_local_buf[0] = '\0';
                  local_238._8_8_ = (this->Dir).Build._M_dataplus._M_p;
                  local_238._0_8_ = (this->Dir).Build._M_string_length;
                  local_238._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x8;
                  local_238._24_8_ = (long)"/usr/include" + 4;
                  views_03._M_len = 2;
                  views_03._M_array = (iterator)local_238;
                  cmCatViews_abi_cxx11_((string *)&local_98,views_03);
                  local_58 = local_78._M_string_length;
                  paStack_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)local_78._M_dataplus._M_p;
                  suffix._M_str = local_78._M_dataplus._M_p;
                  suffix._M_len = local_78._M_string_length;
                  prefix._M_str = (char *)local_98._M_allocated_capacity;
                  prefix._M_len = local_98._8_8_;
                  ConfigFileNamesAndGenex(this,(ConfigString *)local_2f0,&local_258,prefix,suffix);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_allocated_capacity != &local_88) {
                    operator_delete((void *)local_98._M_allocated_capacity,
                                    local_88._M_allocated_capacity + 1);
                  }
                  std::
                  pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  pair<cmQtAutoGenInitializer::ConfigString_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                            ((pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_238,(ConfigString *)local_2f0,&local_258);
                  std::
                  vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
                  ::
                  emplace_back<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>
                            ((vector<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>,std::allocator<std::pair<cmQtAutoGenInitializer::ConfigString,std::__cxx11::string>>>
                              *)local_d0,
                             (pair<cmQtAutoGenInitializer::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._8_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_1d0) {
                    operator_delete((void *)local_1e8._8_8_,(ulong)((long)local_1d0 + 1));
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_218);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_238 + 0x10)) {
                    operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p != &local_258.field_2) {
                    operator_delete(local_258._M_dataplus._M_p,
                                    CONCAT71(local_258.field_2._1_7_,
                                             local_258.field_2._M_local_buf[0]) + 1);
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_2f0 + 0x10)) {
                    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    (ulong)(local_78.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_allocated_capacity != &local_300) {
                    operator_delete((void *)local_310._M_allocated_capacity,
                                    (ulong)(local_300._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_340._M_allocated_capacity != &local_330) {
                    operator_delete((void *)local_340._M_allocated_capacity,
                                    local_330._M_allocated_capacity + 1);
                  }
                }
              }
            }
            else {
              pcVar21 = (puVar36->_M_t).
                        super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t
                        .super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                        super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
              uVar4 = (this->AutogenTarget).Sources._M_h._M_bucket_count;
              uVar27 = (ulong)pcVar21 % uVar4;
              p_Var5 = (this->AutogenTarget).Sources._M_h._M_buckets[uVar27];
              p_Var22 = (__node_base_ptr)0x0;
              if ((p_Var5 != (__node_base_ptr)0x0) &&
                 (p_Var22 = p_Var5, p_Var34 = p_Var5->_M_nxt,
                 pcVar21 != (cmSourceFile *)p_Var5->_M_nxt[1]._M_nxt)) {
                while (p_Var6 = p_Var34->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
                  p_Var22 = (__node_base_ptr)0x0;
                  if (((ulong)p_Var6[1]._M_nxt % uVar4 != uVar27) ||
                     (p_Var22 = p_Var34, p_Var34 = p_Var6,
                     pcVar21 == (cmSourceFile *)p_Var6[1]._M_nxt)) goto LAB_00248ea7;
                }
                p_Var22 = (__node_base_ptr)0x0;
              }
LAB_00248ea7:
              if ((p_Var22 == (__node_base_ptr)0x0) || (p_Var22->_M_nxt == (_Hash_node_base *)0x0))
              {
                local_238._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_238._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_238._16_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)local_2f0,(cmSourceFile *)local_c8,
                           (string *)
                           (puVar36->_M_t).
                           super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                           .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar19,
                           SUB81(local_238,0));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
                }
                if ((*(char *)(local_2f0._0_8_ + 0x41) != '\0') ||
                   (*(char *)(local_2f0._0_8_ + 0x42) == '\x01')) {
                  if (((*(char *)(local_2f0._0_8_ + 0x43) != '\0') ||
                      (*(char *)(local_2f0._0_8_ + 0x44) == '\x01')) &&
                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_2f0._0_8_ + 0x40))->_M_local_buf[0] == '\x01')) {
                    local_238._0_8_ = local_2f0._0_8_;
                    std::
                    vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                    ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                              ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                                *)local_290,(MUFile **)local_238);
                  }
                  std::
                  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)local_268,
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(local_2f0._0_8_ + 0x20),local_2f0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                            ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_2f0,
                             (MUFile *)local_2f0._0_8_);
                }
              }
            }
          }
          else {
            pcVar21 = (puVar36->_M_t).
                      super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
                      super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                      super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
            uVar4 = (this->AutogenTarget).Headers._M_h._M_bucket_count;
            uVar27 = (ulong)pcVar21 % uVar4;
            p_Var5 = (this->AutogenTarget).Headers._M_h._M_buckets[uVar27];
            p_Var22 = (__node_base_ptr)0x0;
            if ((p_Var5 != (__node_base_ptr)0x0) &&
               (p_Var22 = p_Var5, p_Var34 = p_Var5->_M_nxt,
               pcVar21 != (cmSourceFile *)p_Var5->_M_nxt[1]._M_nxt)) {
              while (p_Var6 = p_Var34->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
                p_Var22 = (__node_base_ptr)0x0;
                if (((ulong)p_Var6[1]._M_nxt % uVar4 != uVar27) ||
                   (p_Var22 = p_Var34, p_Var34 = p_Var6, pcVar21 == (cmSourceFile *)p_Var6[1]._M_nxt
                   )) goto LAB_00248d06;
              }
              p_Var22 = (__node_base_ptr)0x0;
            }
LAB_00248d06:
            if ((p_Var22 == (__node_base_ptr)0x0) || (p_Var22->_M_nxt == (_Hash_node_base *)0x0)) {
              local_238._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_238._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_238._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)&local_340,(cmSourceFile *)local_c8,
                         (string *)
                         (puVar36->_M_t).
                         super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                         super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)psVar19,
                         SUB81(local_238,0));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
              }
              uVar24 = local_340._M_allocated_capacity;
              if ((*(char *)(local_340._M_allocated_capacity + 0x41) != '\0') ||
                 (*(char *)(local_340._M_allocated_capacity + 0x42) == '\x01')) {
                paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(((string *)(local_340._M_allocated_capacity + 0x20))->_M_dataplus).
                             _M_p;
                cVar39 = '\x01';
                if (*(char *)(local_340._M_allocated_capacity + 0x43) == '\0') {
                  cVar39 = *(char *)(local_340._M_allocated_capacity + 0x44);
                }
                local_238._0_8_ = paVar26;
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_380._M_string_length ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&DAT_00000002 && this->CMP0100Accept == false) &&
                   (iVar17 = bcmp(local_380._M_dataplus._M_p,"hh",local_380._M_string_length),
                   iVar17 == 0)) {
                  if ((cVar39 != '\0') && (this->CMP0100Warn == true)) {
                    iVar7._M_current =
                         (this->AutogenTarget).CMP0100HeadersWarn.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (this->AutogenTarget).CMP0100HeadersWarn.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)local_d8,
                                 iVar7,(cmSourceFile **)local_238);
                    }
                    else {
                      *iVar7._M_current = (cmSourceFile *)paVar26;
                      pppcVar1 = &(this->AutogenTarget).CMP0100HeadersWarn.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      *pppcVar1 = *pppcVar1 + 1;
                    }
                  }
                }
                else {
                  if ((cVar39 != '\0') &&
                     (*(char *)&(((string *)(uVar24 + 0x40))->_M_dataplus)._M_p == '\x01')) {
                    local_2f0._0_8_ = uVar24;
                    std::
                    vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                    ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                              ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                                *)local_290,(MUFile **)local_2f0);
                  }
                  std::
                  _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)local_318,local_238,&local_340);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_allocated_capacity !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                          ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_340._M_local_buf,
                           (MUFile *)local_340._M_allocated_capacity);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                   local_360.field_2._M_local_buf[0]) + 1);
        }
        puVar36 = puVar36 + 1;
      } while (puVar36 != puVar8);
    }
  }
  bVar16 = (this->Moc).super_GenVarsT.Enabled;
  bVar44 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar16 | bVar44) & 1U) != 0) {
    ppMVar30 = (this->AutogenTarget).FilesGenerated.
               super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar9 = (this->AutogenTarget).FilesGenerated.
              super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar30 != ppMVar9) {
      if (this->CMP0071Accept == true) {
        if (ppMVar30 != ppMVar9) {
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->AutogenTarget).DependFiles,&(*ppMVar30)->FullPath);
            ppMVar30 = ppMVar30 + 1;
          } while (ppMVar30 != ppMVar9);
        }
      }
      else if (this->CMP0071Warn == true) {
        pcVar35 = "SKIP_AUTOGEN";
        PVar25 = 0x6f62a6;
        bVar44 = (bVar44 & 1U) == 0;
        if (bVar44) {
          pcVar35 = "SKIP_AUTOMOC";
        }
        uVar24 = "SKIP_AUTOUIC";
        if (bVar44) {
          uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        }
        local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)0x0;
        if (!bVar44) {
          local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)0xc;
        }
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar24;
        if (bVar16 != false) {
          local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)0xc;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar35;
        }
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        local_360._M_string_length = 0;
        local_360.field_2._M_local_buf[0] = '\0';
        local_320 = paVar26;
        if (ppMVar30 != ppMVar9) {
          do {
            text._M_str = (char *)uVar24;
            text._M_len = (size_t)((*ppMVar30)->FullPath)._M_dataplus._M_p;
            cmQtAutoGen::Quoted_abi_cxx11_
                      ((string *)&local_340,(cmQtAutoGen *)((*ppMVar30)->FullPath)._M_string_length,
                       text);
            local_238._0_8_ = &DAT_00000002;
            local_238._8_8_ = "  ";
            local_238._16_8_ = local_340._8_8_;
            local_238._24_8_ = local_340._M_allocated_capacity;
            local_2f0._0_8_ = &DAT_00000001;
            local_2f0[0x10] = 10;
            local_218._0_8_ = &DAT_00000001;
            views_04._M_len = 3;
            views_04._M_array = (iterator)local_238;
            uVar24 = local_340._8_8_;
            local_2f0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2f0 + 0x10);
            local_218._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_2f0 + 0x10);
            cmCatViews_abi_cxx11_(&local_380,views_04);
            std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_380._M_dataplus._M_p);
            PVar25 = extraout_EDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
              PVar25 = extraout_EDX_00;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_allocated_capacity != &local_330) {
              operator_delete((void *)local_340._M_allocated_capacity,
                              local_330._M_allocated_capacity + 1);
              PVar25 = extraout_EDX_01;
            }
            ppMVar30 = ppMVar30 + 1;
          } while (ppMVar30 != ppMVar9);
        }
        uVar33 = SUB81(paVar26,0);
        pcVar11 = this->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_340,(cmPolicies *)0x47,PVar25);
        uVar15 = local_340._8_8_;
        uVar24 = local_340._M_allocated_capacity;
        local_2f0._8_8_ = local_2f0 + 0x10;
        local_2f0._0_8_ = &DAT_00000001;
        local_2f0[0x10] = 10;
        cmQtAutoGen::Tools_abi_cxx11_
                  ((string *)&local_310,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                   (this->Uic).super_GenVarsT.Enabled,false,(bool)uVar33);
        local_238._0_8_ = uVar15;
        local_238._8_8_ = uVar24;
        local_238._16_8_ = local_2f0._0_8_;
        local_238._24_8_ = local_2f0._8_8_;
        local_218._0_8_ = &DAT_00000044;
        local_218._8_8_ = "For compatibility, CMake is excluding the GENERATED source file(s):\n";
        local_218._16_8_ = local_360._M_string_length;
        local_200 = local_360._M_dataplus._M_p;
        local_1f8._M_p = (pointer)0x13;
        local_1f0 = "from processing by ";
        local_1e8._M_allocated_capacity = local_310._8_8_;
        local_1e8._8_8_ = local_310._M_allocated_capacity;
        local_1d8._M_p = (pointer)0xaa;
        local_1d0 = 
        ".  If any of the files should be processed, set CMP0071 to NEW.  If any of the files should not be processed, explicitly exclude them by setting the source file property "
        ;
        local_1c8._M_allocated_capacity = (size_type)local_318;
        local_1c8._8_8_ = local_320;
        local_1b8._M_p = &DAT_00000028;
        local_1b0 = ":\n  set_property(SOURCE file.h PROPERTY ";
        local_1a8._M_allocated_capacity = (size_type)local_318;
        local_1a8._8_8_ = local_320;
        local_198._M_p = (pointer)0x5;
        local_190 = " ON)\n";
        views_05._M_len = 0xb;
        views_05._M_array = (iterator)local_238;
        cmCatViews_abi_cxx11_(&local_380,views_05);
        cmMakefile::IssueMessage(pcVar11,AUTHOR_WARNING,&local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_allocated_capacity != &local_300) {
          operator_delete((void *)local_310._M_allocated_capacity,
                          (ulong)(local_300._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_allocated_capacity != &local_330) {
          operator_delete((void *)local_340._M_allocated_capacity,
                          local_330._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                   local_360.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  bVar16 = (this->Moc).super_GenVarsT.Enabled;
  bVar44 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar16 | bVar44) & 1U) != 0) {
    ppcVar31 = (this->AutogenTarget).CMP0100HeadersWarn.
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar10 = (this->AutogenTarget).CMP0100HeadersWarn.
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppcVar31 != ppcVar10) {
      pcVar35 = "SKIP_AUTOGEN";
      bVar44 = (bVar44 & 1U) == 0;
      if (bVar44) {
        pcVar35 = "SKIP_AUTOMOC";
      }
      uVar24 = "SKIP_AUTOUIC";
      if (bVar44) {
        uVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)0x0;
      if (!bVar44) {
        local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)0xc;
      }
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar24;
      if (bVar16 != false) {
        local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)0xc;
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar35;
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_360._M_string_length = 0;
      local_360.field_2._M_local_buf[0] = '\0';
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_2f0 + 0x10);
      local_320 = paVar26;
      do {
        psVar19 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar31);
        text_00._M_str = (char *)uVar24;
        text_00._M_len = (size_t)(psVar19->_M_dataplus)._M_p;
        cmQtAutoGen::Quoted_abi_cxx11_
                  ((string *)&local_340,(cmQtAutoGen *)psVar19->_M_string_length,text_00);
        local_238._0_8_ = &DAT_00000002;
        local_238._8_8_ = "  ";
        local_238._16_8_ = local_340._8_8_;
        local_238._24_8_ = local_340._M_allocated_capacity;
        local_2f0._0_8_ = &DAT_00000001;
        local_2f0[0x10] = 10;
        local_218._0_8_ = &DAT_00000001;
        views_06._M_len = 3;
        views_06._M_array = (iterator)local_238;
        uVar24 = local_340._8_8_;
        local_2f0._8_8_ = paVar2;
        local_218._8_8_ = paVar2;
        cmCatViews_abi_cxx11_(&local_380,views_06);
        std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_380._M_dataplus._M_p);
        PVar25 = extraout_EDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          PVar25 = extraout_EDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_allocated_capacity != &local_330) {
          operator_delete((void *)local_340._M_allocated_capacity,
                          local_330._M_allocated_capacity + 1);
          PVar25 = extraout_EDX_04;
        }
        uVar33 = SUB81(paVar26,0);
        ppcVar31 = ppcVar31 + 1;
      } while (ppcVar31 != ppcVar10);
      pcVar11 = this->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_340,(cmPolicies *)0x64,PVar25);
      uVar24 = local_340._M_allocated_capacity;
      local_2f0._0_8_ = &DAT_00000001;
      local_2f0[0x10] = 10;
      local_2f0._8_8_ = paVar2;
      cmQtAutoGen::Tools_abi_cxx11_
                ((string *)&local_310,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                 (this->Uic).super_GenVarsT.Enabled,false,(bool)uVar33);
      local_238._0_8_ = local_340._8_8_;
      local_238._8_8_ = uVar24;
      local_238._16_8_ = local_2f0._0_8_;
      local_238._24_8_ = local_2f0._8_8_;
      local_218._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x3a;
      local_218._8_8_ = "For compatibility, CMake is excluding the header file(s):\n";
      local_218._16_8_ = local_360._M_string_length;
      local_200 = local_360._M_dataplus._M_p;
      local_1f8._M_p = (pointer)0x13;
      local_1f0 = "from processing by ";
      local_1e8._M_allocated_capacity = local_310._8_8_;
      local_1e8._8_8_ = local_310._M_allocated_capacity;
      local_1d8._M_p = (pointer)0xaa;
      local_1d0 = 
      ".  If any of the files should be processed, set CMP0100 to NEW.  If any of the files should not be processed, explicitly exclude them by setting the source file property "
      ;
      local_1c8._M_allocated_capacity = (size_type)local_318;
      local_1c8._8_8_ = local_320;
      local_1b8._M_p = (pointer)0x29;
      local_1b0 = ":\n  set_property(SOURCE file.hh PROPERTY ";
      local_1a8._M_allocated_capacity = (size_type)local_318;
      local_1a8._8_8_ = local_320;
      local_198._M_p = (pointer)0x5;
      local_190 = " ON)\n";
      views_07._M_len = 0xb;
      views_07._M_array = (iterator)local_238;
      cmCatViews_abi_cxx11_(&local_380,views_07);
      cmMakefile::IssueMessage(pcVar11,AUTHOR_WARNING,&local_380);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_allocated_capacity != &local_300) {
        operator_delete((void *)local_310._M_allocated_capacity,
                        (ulong)(local_300._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_allocated_capacity != &local_330) {
        operator_delete((void *)local_340._M_allocated_capacity,local_330._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,
                        CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                 local_360.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_320._4_4_,(this->QtVersion).Major);
    psVar19 = cmGeneratorTarget::GetSafeProperty
                        (this->GenTarget,&(local_298->Keywords_).AUTORCC_OPTIONS);
    arg_01._M_str = (psVar19->_M_dataplus)._M_p;
    arg_01._M_len = psVar19->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_340,arg_01,false);
    pQVar37 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar12 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar37 != pQVar12) {
      lVar43 = 0;
      pQVar38 = pQVar37;
      do {
        pQVar38->Unique = true;
        lVar32 = lVar43;
        pQVar41 = pQVar37;
        do {
          if (((lVar32 != 0) &&
              (__n = (pQVar38->QrcName)._M_string_length, __n == (pQVar41->QrcName)._M_string_length
              )) && ((__n == 0 ||
                     (iVar17 = bcmp((pQVar38->QrcName)._M_dataplus._M_p,
                                    (pQVar41->QrcName)._M_dataplus._M_p,__n), iVar17 == 0)))) {
            pQVar38->Unique = false;
            break;
          }
          pQVar41 = pQVar41 + 1;
          lVar32 = lVar32 + -0x150;
        } while (pQVar41 != pQVar12);
        pQVar38 = pQVar38 + 1;
        lVar43 = lVar43 + 0x150;
      } while (pQVar38 != pQVar12);
    }
    if (pQVar37 != pQVar12) {
      local_318 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&this->PathCheckSum;
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2f0 + 0x10);
      this_00 = (string *)&pQVar37->InfoFile;
      do {
        cmFilePathChecksum::getPart
                  ((string *)local_238,(cmFilePathChecksum *)local_318,(string *)(this_00 + -0x60),
                   10);
        std::__cxx11::string::operator=(this_00 + -0x20,(string *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
        }
        local_238._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_238._0_8_ = (this->Dir).Build._M_string_length;
        local_2f0._0_8_ = &DAT_00000001;
        local_2f0[0x10] = 0x2f;
        local_238._16_8_ = 1;
        local_218._8_8_ = *(undefined8 *)(this_00 + -0x20);
        local_218._0_8_ = *(undefined8 *)(this_00 + -0x18);
        local_218._16_8_ = 5;
        local_200 = "/qrc_";
        local_1f0 = *(char **)(this_00 + -0x40);
        local_1f8._M_p = *(pointer *)(this_00 + -0x38);
        local_1e8._M_allocated_capacity = 4;
        local_1e8._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
             + 0x74;
        views_08._M_len = 6;
        views_08._M_array = (iterator)local_238;
        local_2f0._8_8_ = paVar26;
        local_238._24_8_ = paVar26;
        cmCatViews_abi_cxx11_(&local_360,views_08);
        std::__cxx11::string::operator=(this_00 + 0x78,(string *)&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                   local_360.field_2._M_local_buf[0]) + 1);
        }
        local_238._8_8_ = (this->Dir).Info._M_dataplus._M_p;
        local_238._0_8_ = (this->Dir).Info._M_string_length;
        local_238._16_8_ = 9;
        local_238._24_8_ = "/AutoRcc_";
        local_218._8_8_ = *(undefined8 *)(this_00 + -0x40);
        local_218._0_8_ = *(undefined8 *)(this_00 + -0x38);
        local_2f0._0_8_ = &DAT_00000001;
        local_2f0[0x10] = 0x5f;
        local_218._16_8_ = &DAT_00000001;
        local_1f0 = *(char **)(this_00 + -0x20);
        local_1f8._M_p = *(pointer *)(this_00 + -0x18);
        views_09._M_len = 5;
        views_09._M_array = (iterator)local_238;
        local_2f0._8_8_ = paVar26;
        local_200 = (char *)paVar26;
        cmCatViews_abi_cxx11_(&local_360,views_09);
        local_238._0_8_ = local_360._M_string_length;
        local_238._8_8_ = local_360._M_dataplus._M_p;
        local_238._16_8_ = 10;
        local_238._24_8_ = "_Lock.lock";
        views_10._M_len = 2;
        views_10._M_array = (iterator)local_238;
        cmCatViews_abi_cxx11_((string *)local_2f0,views_10);
        std::__cxx11::string::operator=(this_00 + -0x80,(string *)local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._0_8_ != paVar26) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        local_238._0_8_ = local_360._M_string_length;
        local_238._8_8_ = local_360._M_dataplus._M_p;
        local_238._16_8_ = 10;
        local_238._24_8_ = "_Info.json";
        views_11._M_len = 2;
        views_11._M_array = (iterator)local_238;
        cmCatViews_abi_cxx11_((string *)local_2f0,views_11);
        std::__cxx11::string::operator=(this_00,(string *)local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._0_8_ != paVar26) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        local_238._0_8_ = local_360._M_string_length;
        local_238._8_8_ = local_360._M_dataplus._M_p;
        local_238._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x5;
        local_238._24_8_ = "_Used";
        views_12._M_len = 2;
        views_12._M_array = (iterator)local_238;
        cmCatViews_abi_cxx11_((string *)local_2f0,views_12);
        prefix_00._M_str = (char *)local_2f0._0_8_;
        prefix_00._M_len = local_2f0._8_8_;
        suffix_00._M_str = ".txt";
        suffix_00._M_len = 4;
        ConfigFileNames(this,(ConfigString *)(this_00 + 0x20),prefix_00,suffix_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._0_8_ != paVar26) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                   local_360.field_2._M_local_buf[0]) + 1);
        }
        pQVar37 = (pointer)(this_00 + 0xd0);
        this_00 = this_00 + 0x150;
      } while (pQVar37 != pQVar12);
    }
    pQVar37 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar12 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar37 != pQVar12) {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_310,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_340);
        pcVar13 = (pQVar37->QrcName)._M_dataplus._M_p;
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_360,pcVar13,pcVar13 + (pQVar37->QrcName)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_string_length !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          lVar43 = 0;
          do {
            if (local_360._M_dataplus._M_p[lVar43] == '-') {
              local_360._M_dataplus._M_p[lVar43] = '_';
            }
            lVar43 = lVar43 + 1;
          } while (local_360._M_string_length != lVar43);
        }
        if (pQVar37->Unique == false) {
          local_238._0_8_ = &DAT_00000001;
          local_2f0._8_8_ = local_238 + 0x10;
          local_238[0x10] = 0x5f;
          local_2f0._24_8_ = (pQVar37->QrcPathChecksum)._M_dataplus._M_p;
          local_2f0._16_8_ = (pQVar37->QrcPathChecksum)._M_string_length;
          local_2f0._0_8_ = &DAT_00000001;
          views_13._M_len = 2;
          views_13._M_array = (iterator)local_2f0;
          local_238._8_8_ = local_2f0._8_8_;
          cmCatViews_abi_cxx11_(&local_380,views_13);
          std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_380._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
        }
        local_238._0_8_ = (pointer)0x0;
        local_238._8_8_ = (pointer)0x0;
        local_238._16_8_ = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_238,
                   (char (*) [6])0x754017);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_238,
                   &local_360);
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_310,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_238,4 < (uint)local_320);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                   local_360.field_2._M_local_buf[0]) + 1);
        }
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_310,&pQVar37->Options,4 < (uint)local_320);
        local_238._0_8_ =
             (pQVar37->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_238._8_8_ =
             (pQVar37->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_238._16_8_ =
             (pQVar37->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pQVar37->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_310._M_allocated_capacity;
        (pQVar37->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_310._8_8_;
        (pQVar37->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_300._M_allocated_capacity;
        local_310._M_allocated_capacity = 0;
        local_310._8_8_ = (pointer)0x0;
        local_300._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_238);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_310);
        pQVar37 = pQVar37 + 1;
      } while (pQVar37 != pQVar12);
    }
    pQVar37 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar12 = (this->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pQVar37 != pQVar12) {
      files = &pQVar37->Resources;
      do {
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(files + -2))[1]._M_local_buf[0] == '\0') {
          local_2f0._0_8_ = local_2f0 + 0x10;
          local_2f0._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_2f0._16_8_ = local_2f0._16_8_ & 0xffffffffffffff00;
          local_b8._M_allocated_capacity = (size_type)&local_a8;
          pcVar13 = (this->Rcc).super_GenVarsT.Executable._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar13,
                     pcVar13 + (this->Rcc).super_GenVarsT.Executable._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,
                   &((this->Rcc).super_GenVarsT.ExecutableFeatures.
                     super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->ListOptions);
          cmQtAutoGen::RccLister::RccLister((RccLister *)local_238,(string *)&local_b8,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_allocated_capacity != &local_a8) {
            operator_delete((void *)local_b8._M_allocated_capacity,
                            local_a8._M_allocated_capacity + 1);
          }
          bVar16 = cmQtAutoGen::RccLister::list
                             ((RccLister *)local_238,(string *)((long)(files + -0xc) + 8),files,
                              (string *)local_2f0,false);
          if (bVar16) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_238 + 0x10)) {
              operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2f0 + 0x10)) {
              operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
            }
          }
          else {
            cmSystemTools::Error((string *)local_2f0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_238 + 0x10)) {
              operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2f0 + 0x10)) {
              operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
            }
            if (!bVar16) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_340);
              return false;
            }
          }
        }
        pQVar37 = (pointer)(files + 1);
        files = files + 0xe;
      } while (pQVar37 != pQVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_340);
  }
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmake const* cm = this->Makefile->GetCMakeInstance();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                std::vector<size_t> const& configs,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->FullPath = fullPath;
    muf->SF = sf;
    if (!configs.empty() && configs.size() != this->ConfigsList.size()) {
      muf->Configs = configs;
    }
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUHeader = [this](MUFileHandle&& muf, cm::string_view extension) {
    cmSourceFile* sf = muf->SF;
    const bool muIt = (muf->MocIt || muf->UicIt);
    if (this->CMP0100Accept || (extension != "hh")) {
      // Accept
      if (muIt && muf->Generated) {
        this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
      }
      this->AutogenTarget.Headers.emplace(sf, std::move(muf));
    } else if (muIt && this->CMP0100Warn) {
      // Store file for warning message
      this->AutogenTarget.CMP0100HeadersWarn.push_back(sf);
    }
  };

  auto addMUSource = [this](MUFileHandle&& muf) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
  };

  // Scan through target files
  {
    // Scan through target files
    for (cmGeneratorTarget::AllConfigSource const& acs :
         this->GenTarget->GetAllConfigSources()) {
      std::string const& fullPath = acs.Source->GetFullPath();
      std::string const& extLower =
        cmSystemTools::LowerCase(acs.Source->GetExtension());

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        if (cm->IsAHeaderExtension(extLower)) {
          addMUHeader(makeMUFile(acs.Source, fullPath, acs.Configs, true),
                      extLower);
        } else if (cm->IsACLikeSourceExtension(extLower)) {
          addMUSource(makeMUFile(acs.Source, fullPath, acs.Configs, true));
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((extLower == kw.qrc) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !acs.Source->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = fullPath;
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = acs.Source->GetIsGenerated();
          // RCC options
          {
            std::string const& opts =
              acs.Source->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmExpandList(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetAllConfigSources computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->GenTarget->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    // Header search suffixes and extensions
    static std::initializer_list<cm::string_view> const suffixes{ "", "_p" };
    auto const& exts = cm->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcFullPath = muf.SF->ResolveFullPath();
        std::string basePath = cmStrCat(
          cmQtAutoGen::SubDirPrefix(srcFullPath),
          cmSystemTools::GetFilenameWithoutLastExtension(srcFullPath));
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = cmStrCat(basePath, suffix);
          for (auto const& ext : exts) {
            std::string fullPath = cmStrCat(suffixedPath, '.', ext);

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf =
              this->Makefile->GetSource(fullPath, locationKind);
            if (sf) {
              // Check if we know about this header already
              if (cm::contains(this->AutogenTarget.Headers, sf)) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = this->Makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf) {
              auto eMuf = makeMUFile(sf, fullPath, muf.Configs, true);
              // Only process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              addMUHeader(std::move(eMuf), ext);
            }
          }
        }
      }
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (const auto& sf : this->Makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->ResolveFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->ResolveFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& extLower =
        cmSystemTools::LowerCase(sf->GetExtension());

      if (cm->IsAHeaderExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Headers, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUHeader(std::move(muf), extLower);
          }
        }
      } else if (cm->IsACLikeSourceExtension(extLower)) {
        if (!cm::contains(this->AutogenTarget.Sources, sf.get())) {
          auto muf = makeMUFile(sf.get(), fullPath, {}, false);
          if (muf->SkipMoc || muf->SkipUic) {
            addMUSource(std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (extLower == kw.ui)) {
        // .ui file
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (uicOpts.empty()) {
            this->Uic.UiFilesNoOptions.emplace_back(fullPath);
          } else {
            this->Uic.UiFilesWithOptions.emplace_back(fullPath,
                                                      cmExpandedList(uicOpts));
          }

          auto uiHeaderRelativePath = cmSystemTools::RelativePath(
            this->LocalGen->GetCurrentSourceDirectory(),
            cmSystemTools::GetFilenamePath(fullPath));

          // Avoid creating a path containing adjacent slashes
          if (!uiHeaderRelativePath.empty() &&
              uiHeaderRelativePath.back() != '/') {
            uiHeaderRelativePath += '/';
          }

          auto uiHeaderFilePath = cmStrCat(
            '/', uiHeaderRelativePath, "ui_"_s,
            cmSystemTools::GetFilenameWithoutLastExtension(fullPath), ".h"_s);

          ConfigString uiHeader;
          std::string uiHeaderGenex;
          this->ConfigFileNamesAndGenex(
            uiHeader, uiHeaderGenex, cmStrCat(this->Dir.Build, "/include"_s),
            uiHeaderFilePath);

          this->Uic.UiHeaders.emplace_back(
            std::make_pair(uiHeader, uiHeaderGenex));
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(fullPath);
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->FullPath);
      }
    } else if (this->CMP0071Warn) {
      cm::string_view property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = "SKIP_AUTOGEN";
      } else if (this->Moc.Enabled) {
        property = "SKIP_AUTOMOC";
      } else if (this->Uic.Enabled) {
        property = "SKIP_AUTOUIC";
      }
      std::string files;
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        files += cmStrCat("  ", Quoted(muf->FullPath), '\n');
      }
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0071), '\n',
          "For compatibility, CMake is excluding the GENERATED source "
          "file(s):\n",
          files, "from processing by ",
          cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
          ".  If any of the files should be processed, set CMP0071 to NEW.  "
          "If any of the files should not be processed, "
          "explicitly exclude them by setting the source file property ",
          property, ":\n  set_property(SOURCE file.h PROPERTY ", property,
          " ON)\n"));
    }
  }

  // Generate CMP0100 warning
  if (this->MocOrUicEnabled() &&
      !this->AutogenTarget.CMP0100HeadersWarn.empty()) {
    cm::string_view property;
    if (this->Moc.Enabled && this->Uic.Enabled) {
      property = "SKIP_AUTOGEN";
    } else if (this->Moc.Enabled) {
      property = "SKIP_AUTOMOC";
    } else if (this->Uic.Enabled) {
      property = "SKIP_AUTOUIC";
    }
    std::string files;
    for (cmSourceFile* sf : this->AutogenTarget.CMP0100HeadersWarn) {
      files += cmStrCat("  ", Quoted(sf->GetFullPath()), '\n');
    }
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0100), '\n',
        "For compatibility, CMake is excluding the header file(s):\n", files,
        "from processing by ",
        cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false),
        ".  If any of the files should be processed, set CMP0100 to NEW.  "
        "If any of the files should not be processed, "
        "explicitly exclude them by setting the source file property ",
        property, ":\n  set_property(SOURCE file.hh PROPERTY ", property,
        " ON)\n"));
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget =
      cmExpandedList(this->GenTarget->GetSafeProperty(kw.AUTORCC_OPTIONS));

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Path checksum
      qrc.QrcPathChecksum = this->PathCheckSum.getPart(qrc.QrcFile);
      // Output file name
      qrc.OutputFile = cmStrCat(this->Dir.Build, '/', qrc.QrcPathChecksum,
                                "/qrc_", qrc.QrcName, ".cpp");
      std::string const base = cmStrCat(this->Dir.Info, "/AutoRcc_",
                                        qrc.QrcName, '_', qrc.QrcPathChecksum);
      qrc.LockFile = cmStrCat(base, "_Lock.lock");
      qrc.InfoFile = cmStrCat(base, "_Info.json");
      this->ConfigFileNames(qrc.SettingsFile, cmStrCat(base, "_Used"), ".txt");
    }
    // rcc options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += cmStrCat('_', qrc.QrcPathChecksum);
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // rcc resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}